

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O3

void __thiscall
QtPrivate::QPropertyBindingData::notifyObservers
          (QPropertyBindingData *this,QUntypedPropertyData *propertyDataPtr,QBindingStorage *storage
          )

{
  QPropertyBindingPrivatePtr *__s;
  code *pcVar1;
  undefined8 uVar2;
  NotificationResult NVar3;
  QPropertyBindingData *pQVar4;
  ulong uVar5;
  QPropertyObserver *otherT_1;
  ulong *puVar6;
  long lVar7;
  quintptr dd;
  QPropertyObserverPointer observer;
  ulong *puVar8;
  QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> QVar9;
  long lVar10;
  QPropertyBindingPrivatePtr *this_00;
  quintptr *d;
  ulong uVar11;
  long in_FS_OFFSET;
  QPropertyObserver local_868;
  QPropertyObserverPointer local_850;
  undefined1 local_848 [2072];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  observer.ptr = (QPropertyObserver *)this->d_ptr;
  if (((ulong)observer.ptr & 2) != 0) goto LAB_002be9f8;
  __s = (QPropertyBindingPrivatePtr *)(local_848 + 0x18);
  memset(__s,0xaa,0x800);
  local_848._0_8_ = 0x100;
  local_848._8_8_ = 0;
  if (observer.ptr != (QPropertyObserver *)0x1 && ((ulong)observer.ptr & 1) != 0) {
    observer.ptr = *(QPropertyObserver **)
                    ((long)&observer.ptr[4].super_QPropertyObserverBase.field_2 + 7);
  }
  local_848._16_8_ = __s;
  if ((observer.ptr == (QPropertyObserver *)0x0) ||
     (NVar3 = notifyObserver_helper
                        (this,propertyDataPtr,storage,observer,
                         (PendingBindingObserverList *)local_848), NVar3 == Delayed)) {
LAB_002be9b6:
    if (0 < (long)local_848._8_8_) {
      uVar11 = local_848._8_8_ + 1;
      this_00 = (QPropertyBindingPrivatePtr *)local_848._16_8_;
      do {
        QPropertyBindingPrivatePtr::~QPropertyBindingPrivatePtr(this_00);
        this_00 = this_00 + 1;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
  }
  else {
    if (storage != (QBindingStorage *)0x0) {
      local_868.super_QPropertyObserverBase.next.d = (quintptr)storage;
      this = QBindingStoragePrivate::get((QBindingStoragePrivate *)&local_868,propertyDataPtr);
    }
    pQVar4 = (QPropertyBindingData *)(this->d_ptr & 0xfffffffffffffffc);
    if ((this->d_ptr & 2) == 0) {
      pQVar4 = this;
    }
    puVar6 = (ulong *)pQVar4->d_ptr;
    if (puVar6 != (ulong *)0x1 && ((ulong)puVar6 & 1) != 0) {
      puVar6 = *(ulong **)((long)puVar6 + 0x77);
    }
    if (puVar6 != (ulong *)0x0) {
      do {
        puVar8 = (ulong *)(*puVar6 & 0xfffffffffffffff8);
        if (((uint)*puVar6 & 7) == 1) {
          pcVar1 = (code *)puVar6[2];
          if ((puVar8 == (ulong *)0x0) || (QVar9.d = *puVar8, ((uint)QVar9.d & 7) != 2)) {
            local_868.super_QPropertyObserverBase.field_2.binding = (QPropertyBindingPrivate *)0x0;
            uVar11 = *puVar6;
            *puVar6 = (ulong)((uint)*puVar6 & 7) | (ulong)&local_868;
            uVar5 = uVar11 & 0xfffffffffffffff8;
            if (uVar5 != 0) {
              *(QPropertyObserver **)(uVar5 + 8) = &local_868;
            }
            local_868.super_QPropertyObserverBase.next.d = uVar11 & 0xfffffffffffffff8 | 2;
            local_868.super_QPropertyObserverBase.prev.d = puVar6;
            (*pcVar1)(puVar6,propertyDataPtr);
            QVar9.d = local_868.super_QPropertyObserverBase.next.d;
            local_850.ptr = &local_868;
            QPropertyObserverPointer::unlink_common(&local_850);
          }
          puVar8 = (ulong *)(QVar9.d & 0xfffffffffffffff8);
        }
        puVar6 = puVar8;
      } while (puVar6 != (ulong *)0x0);
    }
    uVar2 = local_848._16_8_;
    if (local_848._8_8_ != 0) {
      lVar10 = local_848._8_8_ << 3;
      lVar7 = 0;
      do {
        QPropertyBindingPrivate::notifyNonRecursive
                  (*(QPropertyBindingPrivate **)((long)(RefCounted **)uVar2 + lVar7));
        lVar7 = lVar7 + 8;
      } while (lVar10 != lVar7);
      goto LAB_002be9b6;
    }
  }
  if ((QPropertyBindingPrivatePtr *)local_848._16_8_ != __s) {
    sizedFree((void *)local_848._16_8_,local_848._0_8_ << 3);
  }
LAB_002be9f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyBindingData::notifyObservers(QUntypedPropertyData *propertyDataPtr, QBindingStorage *storage) const
{
    if (isNotificationDelayed())
        return;
    QPropertyBindingDataPointer d{this};

    PendingBindingObserverList bindingObservers;
    if (QPropertyObserverPointer observer = d.firstObserver()) {
        if (notifyObserver_helper(propertyDataPtr, storage, observer, bindingObservers) == Evaluated) {
            /* evaluateBindings() can trash the observers. We need to re-fetch here.
             "this" might also no longer be valid in case we have a QObjectBindableProperty
             and consequently d isn't either (this happens when binding evaluation has
             caused the binding storage to resize.
             If storage is nullptr, then there is no dynamically resizable storage,
             and we cannot run into the issue.
            */
            if (storage)
                d = QPropertyBindingDataPointer {storage->bindingData(propertyDataPtr)};
            if (QPropertyObserverPointer observer = d.firstObserver())
                observer.notify(propertyDataPtr);
            for (auto &&bindingPtr: bindingObservers) {
                auto *binding = static_cast<QPropertyBindingPrivate *>(bindingPtr.get());
                binding->notifyNonRecursive();
            }
        }
    }
}